

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::IntervalAdd::AddConstant<duckdb::IntervalAvgState,duckdb::interval_t>
          (IntervalAdd *this,IntervalAvgState *state,interval_t input,idx_t count)

{
  bool bVar1;
  interval_t iVar2;
  undefined1 auVar3 [16];
  long result;
  long local_50;
  string local_48;
  
  bVar1 = duckdb::TryCast::Operation<unsigned_long,long>((ulong)input.micros,&local_50,false);
  if (bVar1) {
    iVar2.micros = input._0_8_;
    iVar2._0_8_ = state;
    iVar2 = duckdb::MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                      (iVar2,local_50);
    iVar2 = duckdb::AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                      (*(interval_t *)(this + 8),iVar2);
    *(interval_t *)(this + 8) = iVar2;
    return;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_long,long>(&local_48,(duckdb *)input.micros,auVar3._8_8_);
  duckdb::InvalidInputException::InvalidInputException(auVar3._0_8_,(string *)&local_48);
  __cxa_throw(auVar3._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void AddConstant(STATE &state, T input, idx_t count) {
		const auto count64 = Cast::Operation<idx_t, int64_t>(count);
		input = MultiplyOperator::Operation<interval_t, int64_t, interval_t>(input, count64);
		state.value = AddOperator::Operation<interval_t, interval_t, interval_t>(state.value, input);
	}